

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O0

char * __thiscall Database::MaxHeap::getResults(MaxHeap *this)

{
  int iVar1;
  char *__s;
  long lVar2;
  MaxHeap *in_RDI;
  int i_1;
  int pos;
  char *char_buf;
  int i;
  int local_20;
  int local_1c;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  
  uVar3 = (uint)in_RDI->size;
  while (uVar3 = uVar3 - 1, 0 < (int)uVar3) {
    swap(in_RDI,0,uVar3);
    adjust((MaxHeap *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
           (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  }
  __s = (char *)operator_new__((long)(int)((in_RDI->size + 1) * 0x28));
  local_1c = sprintf(__s,"l_orderkey|o_orderdate|revenue\n");
  for (local_20 = 0; (local_20 < (int)(uint)in_RDI->size && (in_RDI->c3Result[local_20] != 0));
      local_20 = local_20 + 1) {
    lVar2 = (long)local_20;
    uVar3 = (uint)in_RDI->c2Result[lVar2];
    iVar1 = sprintf(__s + local_1c,"%u|199%d-%02d-%02d|%.2f\n",
                    (double)in_RDI->c3Result[lVar2] / 100.0,(ulong)in_RDI->c1Result[lVar2],
                    (ulong)(uVar3 / 10000 + 2),(ulong)(uVar3 % 10000) / 100,(ulong)(uVar3 % 100));
    local_1c = iVar1 + local_1c;
  }
  return __s;
}

Assistant:

char* getResults() {
      for (int i = size - 1; i > 0; i--) {
        swap(0, i);
        adjust(i);
      }

      auto char_buf = new char[40 * (size + 1)];
      int pos = 0;
      pos += sprintf(char_buf, "l_orderkey|o_orderdate|revenue\n");
      for (int i = 0; i < size; i++) {
        if (c3Result[i] > 0) {
          pos += sprintf(char_buf + pos,
                         "%u|199%d-%02d-%02d|%.2f\n", c1Result[i],
                         c2Result[i] / 10000 + 2, (c2Result[i] % 10000) / 100, c2Result[i] % 100,
                         (double) c3Result[i] / 100.0);
        } else {
          break;
        }
      }
      return char_buf;
    }